

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O2

Amap_Lib_t * Amap_LibReadBuffer(char *pBuffer,int fVerbose)

{
  Vec_Ptr_t *vTokens;
  Amap_Lib_t *pAVar1;
  int fVerbose_00;
  
  fVerbose_00 = 0;
  Amap_RemoveComments(pBuffer,(int *)0x0,(int *)0x0);
  vTokens = Amap_DeriveTokens(pBuffer);
  pAVar1 = Amap_ParseTokens(vTokens,fVerbose_00);
  Vec_PtrFree(vTokens);
  return pAVar1;
}

Assistant:

Amap_Lib_t * Amap_LibReadBuffer( char * pBuffer, int fVerbose )
{
    Amap_Lib_t * pLib;
    Vec_Ptr_t * vTokens;
    Amap_RemoveComments( pBuffer, NULL, NULL );
    vTokens = Amap_DeriveTokens( pBuffer );
    pLib = Amap_ParseTokens( vTokens, fVerbose );
    if ( pLib == NULL )
    {
        Vec_PtrFree( vTokens );
        return NULL;
    }
    Vec_PtrFree( vTokens );
    return pLib;
}